

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void checkclosemth(lua_State *L,StkId level)

{
  TValue *pTVar1;
  char *local_30;
  char *vname;
  int idx;
  TValue *tm;
  StkId level_local;
  lua_State *L_local;
  
  pTVar1 = luaT_gettmbyobj(L,&level->val,TM_CLOSE);
  if ((pTVar1->tt_ & 0xf) == 0) {
    local_30 = luaG_findlocal(L,L->ci,(int)((long)level - (L->ci->func).offset >> 4),(StkId *)0x0);
    if (local_30 == (char *)0x0) {
      local_30 = "?";
    }
    luaG_runerror(L,"variable \'%s\' got a non-closable value",local_30);
  }
  return;
}

Assistant:

static void checkclosemth (lua_State *L, StkId level) {
  const TValue *tm = luaT_gettmbyobj(L, s2v(level), TM_CLOSE);
  if (ttisnil(tm)) {  /* no metamethod? */
    int idx = cast_int(level - L->ci->func.p);  /* variable index */
    const char *vname = luaG_findlocal(L, L->ci, idx, NULL);
    if (vname == NULL) vname = "?";
    luaG_runerror(L, "variable '%s' got a non-closable value", vname);
  }
}